

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counting.hpp
# Opt level: O2

double ising::counting::free_energy<lattice::graph>
                 (double beta,graph *lat,vector<double,_std::allocator<double>_> *inter,
                 vector<double,_std::allocator<double>_> *field)

{
  pointer pbVar1;
  long lVar2;
  ulong uVar3;
  invalid_argument *this;
  unsigned_long c;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  exp_double weight;
  exp_number<double> local_58;
  ulong local_48;
  exp_double sum;
  
  if (beta <= 0.0) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"beta should be positive");
  }
  else {
    lVar2 = (long)(lat->sites_).
                  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(lat->sites_).
                  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = lVar2 / 0x38;
    if (uVar3 < 0x1f) {
      lVar6 = (long)(inter->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(inter->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      lVar2 = (long)(lat->bonds_).
                    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(lat->bonds_).
                    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if (lVar6 == lVar2 / 0x18) {
        lVar2 = (long)(field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
        if ((lVar2 == 0) || (lVar2 >> 3 == uVar3)) {
          local_48 = (ulong)(uint)(1 << ((byte)uVar3 & 0x1f));
          sum.sign_ = 0;
          sum.log_ = 0.0;
          dVar7 = beta;
          for (uVar3 = 0; uVar3 != local_48; uVar3 = uVar3 + 1) {
            weight.sign_ = 1;
            weight.log_ = 0.0;
            uVar4 = 0;
            while( true ) {
              uVar5 = (ulong)uVar4;
              pbVar1 = (lat->bonds_).
                       super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)(((long)(lat->bonds_).
                                 super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) / 0x18)
                  <= uVar5) break;
              standards::exp_number<double>::exp_number
                        (&local_58,
                         (double)(int)(1 - (((uint)(uVar3 >> ((byte)pbVar1[uVar5].target & 0x3f)) ^
                                            (uint)(uVar3 >> ((byte)pbVar1[uVar5].source & 0x3f))) *
                                            2 & 2)) *
                         (inter->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar5] * beta);
              weight.log_ = weight.log_ + local_58.log_;
              weight.sign_ = weight.sign_ * local_58.sign_;
              if (ABS(weight.log_ / local_58.log_) < 1e-10) {
                weight.log_ = 0.0;
              }
              uVar4 = uVar4 + 1;
            }
            if ((field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish !=
                (field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start) {
              uVar4 = 0;
              while( true ) {
                if ((ulong)(((long)(lat->sites_).
                                   super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(lat->sites_).
                                  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x38) <= (ulong)uVar4
                   ) break;
                standards::exp_number<double>::exp_number
                          (&local_58,
                           (double)(int)(1 - ((int)(uVar3 >> ((byte)uVar4 & 0x3f)) * 2 & 2U)) *
                           (field->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar4] * beta);
                weight.log_ = weight.log_ + local_58.log_;
                weight.sign_ = weight.sign_ * local_58.sign_;
                if (ABS(weight.log_ / local_58.log_) < 1e-10) {
                  weight.log_ = 0.0;
                }
                uVar4 = uVar4 + 1;
              }
            }
            standards::exp_number<double>::operator+=(&sum,&weight);
            dVar7 = extraout_XMM0_Qa;
          }
          dVar7 = standards::exp_number<double>::log(&sum,dVar7);
          return -dVar7 / beta;
        }
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"inconsitent table size of external field");
      }
      else {
        this = (invalid_argument *)__cxa_allocate_exception(0x10,lVar6,lVar2 % 0x18);
        std::invalid_argument::invalid_argument(this,"inconsitent table size of interaction");
      }
    }
    else {
      this = (invalid_argument *)__cxa_allocate_exception(0x10,inter,lVar2 % 0x38);
      std::invalid_argument::invalid_argument(this,"too large lattice");
    }
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static double free_energy(double beta, LATTICE const& lat, std::vector<double> const& inter,
                            std::vector<double> const& field = std::vector<double>(0)) {
    if (beta <= 0)
      throw(std::invalid_argument("beta should be positive"));
    if (lat.num_sites() > 30)
      throw(std::invalid_argument("too large lattice"));
    if (inter.size() != lat.num_bonds())
      throw(std::invalid_argument("inconsitent table size of interaction"));
    if (field.size() > 0 && field.size() != lat.num_sites())
      throw(std::invalid_argument("inconsitent table size of external field"));
    unsigned long num_states = 1 << lat.num_sites();
    standards::exp_double sum = 0;
    for (unsigned long c = 0; c < num_states; ++c) {
      standards::exp_double weight = 1;
      for (unsigned int b = 0; b < lat.num_bonds(); ++b) {
        int ci = (c >> lat.source(b)) & 1;
        int cj = (c >> lat.target(b)) & 1;
        weight *= standards::exp_number<double>(beta * inter[b] * (1 - 2 * (ci ^ cj)));
      }
      if (field.size()) {
        for (unsigned int s = 0; s < lat.num_sites(); ++s) {
          int c0 = (c >> s) & 1;
          weight *= standards::exp_number<double>(beta * field[s] * (1 - 2 * c0));
        }
      }
      sum += weight;
    }
    return -log(sum) / beta;
  }